

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O3

void __thiscall MathOp::Raw_Tanh::forward(Raw_Tanh *this)

{
  Mat *pMVar1;
  Mat local_30;
  
  Op::reinit(&this->super_Op);
  pMVar1 = NeuronMat::getForward(this->a);
  Mat::raw_tanh(&local_30,pMVar1);
  pMVar1 = NeuronMat::getForward(this->res);
  Mat::operator=(pMVar1,&local_30);
  Mat::~Mat(&local_30);
  return;
}

Assistant:

void MathOp::Raw_Tanh::forward(){
    reinit();
    *res->getForward()=a->getForward()->raw_tanh();
}